

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O0

void parse_affix_argument(vw *all,string *str)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  char *__src;
  vw_exception *this;
  string *pmessage;
  undefined8 uVar4;
  ostream *poVar5;
  long in_RDI;
  uint16_t afx;
  stringstream __msg_2;
  stringstream __msg_1;
  uint16_t ns;
  uint16_t len;
  stringstream __msg;
  uint16_t prefix;
  char *q;
  char *p;
  char *cstr;
  string *in_stack_fffffffffffffa78;
  int in_stack_fffffffffffffa84;
  char *in_stack_fffffffffffffa88;
  vw_exception *in_stack_fffffffffffffa90;
  stringstream local_528 [16];
  ostream local_518;
  size_t in_stack_fffffffffffffc28;
  stringstream local_378 [16];
  ostream local_368;
  ushort local_1ee;
  short local_1ec;
  undefined1 local_1e9;
  stringstream local_1b8 [16];
  ostream local_1a8;
  ushort local_2a;
  char *local_28;
  char *local_20;
  char *local_18;
  long local_8;
  
  local_8 = in_RDI;
  lVar2 = std::__cxx11::string::length();
  if (lVar2 != 0) {
    std::__cxx11::string::length();
    pcVar3 = calloc_or_throw<char>(in_stack_fffffffffffffc28);
    local_18 = pcVar3;
    __src = (char *)std::__cxx11::string::c_str();
    strcpy(pcVar3,__src);
    local_20 = strtok(local_18,",");
    while (local_20 != (char *)0x0) {
      local_28 = local_20;
      local_2a = 1;
      if (*local_20 == '+') {
        local_28 = local_20 + 1;
      }
      else {
        if (*local_20 == '-') {
          local_28 = local_20 + 1;
        }
        local_2a = (ushort)(*local_20 != '-');
      }
      if ((*local_28 < '1') || ('7' < *local_28)) {
        std::__cxx11::stringstream::stringstream(local_1b8);
        this = (vw_exception *)
               std::operator<<(&local_1a8,"malformed affix argument (length must be 1..7): ");
        std::operator<<((ostream *)this,local_20);
        local_1e9 = 1;
        pcVar3 = (char *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringstream::str();
        VW::vw_exception::vw_exception
                  (this,pcVar3,in_stack_fffffffffffffa84,in_stack_fffffffffffffa78);
        local_1e9 = 0;
        __cxa_throw(pcVar3,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      local_1ec = *local_28 + -0x30;
      local_1ee = 0x20;
      if (local_28[1] != '\0') {
        bVar1 = valid_ns(local_28[1]);
        in_stack_fffffffffffffa84 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffa84);
        if (!bVar1) {
          std::__cxx11::stringstream::stringstream(local_378);
          pmessage = (string *)
                     std::operator<<(&local_368,"malformed affix argument (invalid namespace): ");
          std::operator<<((ostream *)pmessage,local_20);
          uVar4 = __cxa_allocate_exception(0x38);
          std::__cxx11::stringstream::str();
          VW::vw_exception::vw_exception
                    (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa84,
                     pmessage);
          __cxa_throw(uVar4,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
        local_1ee = (ushort)local_28[1];
        if (local_28[2] != '\0') {
          std::__cxx11::stringstream::stringstream(local_528);
          poVar5 = std::operator<<(&local_518,"malformed affix argument (too long): ");
          std::operator<<(poVar5,local_20);
          uVar4 = __cxa_allocate_exception(0x38);
          std::__cxx11::stringstream::str();
          VW::vw_exception::vw_exception
                    (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa84,
                     in_stack_fffffffffffffa78);
          __cxa_throw(uVar4,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
      }
      *(long *)(local_8 + 0x1300 + (ulong)local_1ee * 8) =
           *(long *)(local_8 + 0x1300 + (ulong)local_1ee * 8) << 4;
      *(ulong *)(local_8 + 0x1300 + (ulong)local_1ee * 8) =
           (ulong)(ushort)(local_1ec << 1 | local_2a & 1) |
           *(ulong *)(local_8 + 0x1300 + (ulong)local_1ee * 8);
      local_20 = strtok((char *)0x0,",");
    }
    free(local_18);
  }
  return;
}

Assistant:

void parse_affix_argument(vw& all, string str)
{
  if (str.length() == 0)
    return;
  char* cstr = calloc_or_throw<char>(str.length() + 1);
  strcpy(cstr, str.c_str());

  char* p = strtok(cstr, ",");

  try
  {
    while (p != 0)
    {
      char* q = p;
      uint16_t prefix = 1;
      if (q[0] == '+')
      {
        q++;
      }
      else if (q[0] == '-')
      {
        prefix = 0;
        q++;
      }
      if ((q[0] < '1') || (q[0] > '7'))
        THROW("malformed affix argument (length must be 1..7): " << p);

      uint16_t len = (uint16_t)(q[0] - '0');
      uint16_t ns = (uint16_t)' ';  // default namespace
      if (q[1] != 0)
      {
        if (valid_ns(q[1]))
          ns = (uint16_t)q[1];
        else
          THROW("malformed affix argument (invalid namespace): " << p);

        if (q[2] != 0)
          THROW("malformed affix argument (too long): " << p);
      }

      uint16_t afx = (len << 1) | (prefix & 0x1);
      all.affix_features[ns] <<= 4;
      all.affix_features[ns] |= afx;

      p = strtok(nullptr, ",");
    }
  }
  catch (...)
  {
    free(cstr);
    throw;
  }

  free(cstr);
}